

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O2

err_t cmdCVCsCount(size_t *count,octet *certs,size_t certs_len)

{
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    *count = sVar1;
    if (certs_len == 0) {
      return 0;
    }
    sVar1 = btokCVCLen(certs,certs_len);
    if (sVar1 == 0xffffffffffffffff) break;
    certs_len = certs_len - sVar1;
    certs = certs + sVar1;
    sVar1 = *count + 1;
  }
  return 0x204;
}

Assistant:

err_t cmdCVCsCount(size_t* count, const octet* certs, size_t certs_len)
{
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsValid(count, O_PER_S));
	// цикл по сертификатам
	for (*count = 0; certs_len; ++*count)
	{
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			return ERR_BAD_CERTRING;
		certs += len, certs_len -= len;
	}
	return ERR_OK;
}